

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O0

void __thiscall CFGsContainer::processCFGs(CFGsContainer *this)

{
  Type TVar1;
  Addr AVar2;
  Type TVar3;
  int size;
  CFG *this_00;
  BlockData *this_01;
  Instruction *instr;
  mapped_type *ppCVar4;
  Data *data;
  bool bVar5;
  PhantomData *phantomData;
  CfgNode *succ;
  CFG *pCStack_98;
  bool indirection;
  CFG *handler;
  CFG *pCStack_88;
  int sigid;
  CFG *call;
  int instr_size;
  int block_size;
  CfgNode *block;
  BlockData *blockData;
  CFG *cfg_1;
  Addr addr_1;
  string local_50 [7];
  bool complete;
  string name;
  CFG *local_20;
  CFG *cfg;
  Addr addr;
  CFGsContainer *this_local;
  
  addr = (Addr)this;
  do {
    if ((this->m_currentToken).type != TKN_BRACKET_OPEN) {
      return;
    }
    matchToken(this,TKN_BRACKET_OPEN);
    while( true ) {
      bVar5 = true;
      if ((this->m_currentToken).type != TKN_CFG) {
        bVar5 = (this->m_currentToken).type == TKN_NODE;
      }
      if (!bVar5) break;
      TVar1 = (this->m_currentToken).type;
      if (TVar1 == TKN_CFG) {
        matchToken(this,TKN_CFG);
        cfg = *(CFG **)&(this->m_currentToken).data;
        matchToken(this,TKN_ADDR);
        if ((this->m_currentToken).type == TKN_COLON) {
          matchToken(this,TKN_COLON);
          matchToken(this,TKN_NUMBER);
        }
        local_20 = CFGsContainer::cfg(this,(Addr)cfg);
        if (local_20 == (CFG *)0x0) {
          local_20 = (CFG *)operator_new(0x80);
          CFG::CFG(local_20,(Addr)cfg);
          ppCVar4 = std::
                    map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                    ::operator[](&this->m_cfgsMap,(key_type *)&cfg);
          *ppCVar4 = local_20;
        }
        std::__cxx11::string::string(local_50,(string *)&(this->m_currentToken).token);
        matchToken(this,TKN_TEXT);
        CFG::setFunctionName(local_20,(string *)local_50);
        addr_1._7_1_ = (this->m_currentToken).data.boolean & 1;
        matchToken(this,TKN_BOOL);
        std::__cxx11::string::~string(local_50);
      }
      else {
        if (TVar1 != TKN_NODE) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                        ,0x1d5,"void CFGsContainer::processCFGs()");
        }
        matchToken(this,TKN_NODE);
        cfg_1 = *(CFG **)&(this->m_currentToken).data;
        matchToken(this,TKN_ADDR);
        this_00 = CFGsContainer::cfg(this,(Addr)cfg_1);
        if (this_00 == (CFG *)0x0) {
          __assert_fail("cfg != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                        ,0x14b,"void CFGsContainer::processCFGs()");
        }
        cfg_1 = *(CFG **)&(this->m_currentToken).data;
        matchToken(this,TKN_ADDR);
        this_01 = (BlockData *)operator_new(0x90);
        CfgNode::BlockData::BlockData(this_01,(Addr)cfg_1);
        _instr_size = CFG::nodeByAddr(this_00,(Addr)cfg_1);
        if (_instr_size == (CfgNode *)0x0) {
          _instr_size = (CfgNode *)operator_new(0x78);
          CfgNode::CfgNode(_instr_size,CFG_BLOCK);
          CfgNode::setData(_instr_size,(Data *)this_01);
          CFG::addNode(this_00,_instr_size);
        }
        else {
          TVar3 = CfgNode::type(_instr_size);
          if (TVar3 != CFG_PHANTOM) {
            __assert_fail("block->type() == CfgNode::CFG_PHANTOM",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                          ,0x153,"void CFGsContainer::processCFGs()");
          }
          CfgNode::setData(_instr_size,(Data *)this_01);
        }
        matchToken(this,TKN_NUMBER);
        matchToken(this,TKN_BRACKET_OPEN);
        while ((this->m_currentToken).type == TKN_NUMBER) {
          size = (int)(this->m_currentToken).data.addr;
          matchToken(this,TKN_NUMBER);
          instr = Instruction::get((Addr)cfg_1,size);
          CfgNode::BlockData::addInstruction(this_01,instr);
          cfg_1 = (CFG *)((long)&cfg_1->_vptr_CFG + (long)size);
        }
        matchToken(this,TKN_BRACKET_CLOSE);
        matchToken(this,TKN_BRACKET_OPEN);
        while ((this->m_currentToken).type == TKN_ADDR) {
          cfg_1 = *(CFG **)&(this->m_currentToken).data;
          matchToken(this,TKN_ADDR);
          if ((this->m_currentToken).type == TKN_COLON) {
            matchToken(this,TKN_COLON);
            matchToken(this,TKN_NUMBER);
          }
          pCStack_88 = CFGsContainer::cfg(this,(Addr)cfg_1);
          if (pCStack_88 == (CFG *)0x0) {
            pCStack_88 = (CFG *)operator_new(0x80);
            CFG::CFG(pCStack_88,(Addr)cfg_1);
            ppCVar4 = std::
                      map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                      ::operator[](&this->m_cfgsMap,(key_type *)&cfg_1);
            *ppCVar4 = pCStack_88;
          }
          CfgNode::BlockData::addCall(this_01,pCStack_88);
        }
        matchToken(this,TKN_BRACKET_CLOSE);
        matchToken(this,TKN_BRACKET_OPEN);
        while ((this->m_currentToken).type == TKN_NUMBER) {
          AVar2 = (this->m_currentToken).data.addr;
          matchToken(this,TKN_NUMBER);
          matchToken(this,TKN_ARROW);
          cfg_1 = *(CFG **)&(this->m_currentToken).data;
          matchToken(this,TKN_ADDR);
          if ((this->m_currentToken).type == TKN_COLON) {
            matchToken(this,TKN_COLON);
            matchToken(this,TKN_NUMBER);
          }
          pCStack_98 = CFGsContainer::cfg(this,(Addr)cfg_1);
          if (pCStack_98 == (CFG *)0x0) {
            pCStack_98 = (CFG *)operator_new(0x80);
            CFG::CFG(pCStack_98,(Addr)cfg_1);
            ppCVar4 = std::
                      map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                      ::operator[](&this->m_cfgsMap,(key_type *)&cfg_1);
            *ppCVar4 = pCStack_98;
          }
          CfgNode::BlockData::addSignalHandler(this_01,(int)AVar2,pCStack_98);
        }
        matchToken(this,TKN_BRACKET_CLOSE);
        bVar5 = (this->m_currentToken).data.boolean;
        matchToken(this,TKN_BOOL);
        CfgNode::BlockData::setIndirect(this_01,(bool)(bVar5 & 1));
        matchToken(this,TKN_BRACKET_OPEN);
        while( true ) {
          bVar5 = true;
          if (((this->m_currentToken).type != TKN_ADDR) &&
             (bVar5 = true, (this->m_currentToken).type != TKN_EXIT)) {
            bVar5 = (this->m_currentToken).type == TKN_HALT;
          }
          if (!bVar5) break;
          TVar1 = (this->m_currentToken).type;
          if (TVar1 == TKN_EXIT) {
            matchToken(this,TKN_EXIT);
            phantomData = (PhantomData *)CFG::exitNode(this_00);
            if ((CfgNode *)phantomData == (CfgNode *)0x0) {
              phantomData = (PhantomData *)operator_new(0x78);
              CfgNode::CfgNode((CfgNode *)phantomData,CFG_EXIT);
              CFG::addNode(this_00,(CfgNode *)phantomData);
            }
          }
          else if (TVar1 == TKN_HALT) {
            matchToken(this,TKN_HALT);
            phantomData = (PhantomData *)CFG::haltNode(this_00);
            if ((CfgNode *)phantomData == (CfgNode *)0x0) {
              phantomData = (PhantomData *)operator_new(0x78);
              CfgNode::CfgNode((CfgNode *)phantomData,CFG_HALT);
              CFG::addNode(this_00,(CfgNode *)phantomData);
            }
          }
          else {
            if (TVar1 != TKN_ADDR) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                            ,0x1c6,"void CFGsContainer::processCFGs()");
            }
            cfg_1 = *(CFG **)&(this->m_currentToken).data;
            matchToken(this,TKN_ADDR);
            phantomData = (PhantomData *)CFG::nodeByAddr(this_00,(Addr)cfg_1);
            if ((CfgNode *)phantomData == (CfgNode *)0x0) {
              data = (Data *)operator_new(0x10);
              CfgNode::PhantomData::PhantomData((PhantomData *)data,(Addr)cfg_1);
              phantomData = (PhantomData *)operator_new(0x78);
              CfgNode::CfgNode((CfgNode *)phantomData,CFG_PHANTOM);
              CfgNode::setData((CfgNode *)phantomData,data);
              CFG::addNode(this_00,(CfgNode *)phantomData);
            }
          }
          if ((this->m_currentToken).type == TKN_COLON) {
            matchToken(this,TKN_COLON);
            matchToken(this,TKN_NUMBER);
          }
          CFG::addEdge(this_00,_instr_size,(CfgNode *)phantomData);
        }
        matchToken(this,TKN_BRACKET_CLOSE);
      }
    }
    matchToken(this,TKN_BRACKET_CLOSE);
  } while( true );
}

Assistant:

void CFGsContainer::processCFGs() {
	while (m_currentToken.type == Lexeme::TKN_BRACKET_OPEN) {
		matchToken(Lexeme::TKN_BRACKET_OPEN);

		while (m_currentToken.type == Lexeme::TKN_CFG ||
			   m_currentToken.type == Lexeme::TKN_NODE) {
			switch (m_currentToken.type) {
				case Lexeme::TKN_CFG:
				{
					matchToken(Lexeme::TKN_CFG);

					Addr addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					if (m_currentToken.type == Lexeme::TKN_COLON) {
						matchToken(Lexeme::TKN_COLON);
						matchToken(Lexeme::TKN_NUMBER);
					}

					CFG* cfg = this->cfg(addr);
					if (!cfg) {
						cfg = new CFG(addr);
						m_cfgsMap[addr] = cfg;
					}

					std::string name = m_currentToken.token;
					matchToken(Lexeme::TKN_TEXT);
					cfg->setFunctionName(name);

					bool complete = m_currentToken.data.boolean;
					matchToken(Lexeme::TKN_BOOL);
					(void) complete;

					break;
				}
				case Lexeme::TKN_NODE:
				{
					matchToken(Lexeme::TKN_NODE);

					Addr addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					CFG* cfg = this->cfg(addr);
					assert(cfg != 0);

					addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					CfgNode::BlockData* blockData = new CfgNode::BlockData(addr);
					CfgNode* block = cfg->nodeByAddr(addr);
					if (block) {
						assert(block->type() == CfgNode::CFG_PHANTOM);
						block->setData(blockData);
					} else {
						block = new CfgNode(CfgNode::CFG_BLOCK);
						block->setData(blockData);
						cfg->addNode(block);
					}

					int block_size = m_currentToken.data.number;
					matchToken(Lexeme::TKN_NUMBER);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_NUMBER) {
						int instr_size = m_currentToken.data.number;
						matchToken(Lexeme::TKN_NUMBER);

						blockData->addInstruction(Instruction::get(addr, instr_size));
						addr += instr_size;
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					// assert((addr - blockData->addr()) == block_size);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_ADDR) {
						addr = m_currentToken.data.addr;
						matchToken(Lexeme::TKN_ADDR);

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						CFG* call = this->cfg(addr);
						if (!call) {
							call = new CFG(addr);
							m_cfgsMap[addr] = call;
						}

						blockData->addCall(call);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_NUMBER) {
						int sigid = m_currentToken.data.number;
						matchToken(Lexeme::TKN_NUMBER);

						matchToken(Lexeme::TKN_ARROW);

						addr = m_currentToken.data.addr;
						matchToken(Lexeme::TKN_ADDR);

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						CFG* handler = this->cfg(addr);
						if (!handler) {
							handler = new CFG(addr);
							m_cfgsMap[addr] = handler;
						}

						blockData->addSignalHandler(sigid, handler);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					bool indirection = m_currentToken.data.boolean;
					matchToken(Lexeme::TKN_BOOL);

					blockData->setIndirect(indirection);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_ADDR ||
						   m_currentToken.type == Lexeme::TKN_EXIT ||
						   m_currentToken.type == Lexeme::TKN_HALT) {
						CfgNode* succ;
						switch (m_currentToken.type) {
							case Lexeme::TKN_ADDR:
								addr = m_currentToken.data.addr;
								matchToken(Lexeme::TKN_ADDR);

								if (!(succ = cfg->nodeByAddr(addr))) {
									CfgNode::PhantomData* phantomData =
											new CfgNode::PhantomData(addr);

									succ = new CfgNode(CfgNode::CFG_PHANTOM);
									succ->setData(phantomData);

									cfg->addNode(succ);
								}

								break;
							case Lexeme::TKN_EXIT:
								matchToken(Lexeme::TKN_EXIT);

								succ = cfg->exitNode();
								if (!succ) {
									succ = new CfgNode(CfgNode::CFG_EXIT);
									cfg->addNode(succ);
								}

								break;
							case Lexeme::TKN_HALT:
								matchToken(Lexeme::TKN_HALT);

								succ = cfg->haltNode();
								if (!succ) {
									succ = new CfgNode(CfgNode::CFG_HALT);
									cfg->addNode(succ);
								}

								break;
							default:
								assert(false);
						}

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						cfg->addEdge(block, succ);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					break;
				}
				default:
					assert(false);
			}
		}

		matchToken(Lexeme::TKN_BRACKET_CLOSE);
	}
}